

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::FboTestUtil::TextureCubeArrayShader::setFace
          (TextureCubeArrayShader *this,CubeFace face)

{
  float *pfVar1;
  int row_1;
  float *pfVar2;
  int row;
  long lVar3;
  float *pfVar4;
  Mat3 *pMVar5;
  int col;
  long lVar6;
  float local_28 [10];
  
  pfVar1 = setFace::s_cubeTransforms[face];
  pfVar2 = local_28;
  local_28[4] = 0.0;
  local_28[5] = 0.0;
  local_28[6] = 0.0;
  local_28[7] = 0.0;
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  local_28[3] = 0.0;
  local_28[8] = 0.0;
  lVar3 = 0;
  do {
    lVar6 = 0;
    pfVar4 = pfVar2;
    do {
      *pfVar4 = pfVar1[lVar6];
      lVar6 = lVar6 + 1;
      pfVar4 = pfVar4 + 3;
    } while (lVar6 != 3);
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 1;
    pfVar1 = pfVar1 + 3;
  } while (lVar3 != 3);
  pMVar5 = &this->m_coordMat;
  pfVar1 = local_28;
  lVar3 = 0;
  do {
    lVar6 = 0;
    do {
      *(undefined4 *)((long)(pMVar5->m_data).m_data[0].m_data + lVar6) =
           *(undefined4 *)((long)pfVar1 + lVar6);
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x24);
    lVar3 = lVar3 + 1;
    pMVar5 = (Mat3 *)((pMVar5->m_data).m_data[0].m_data + 1);
    pfVar1 = pfVar1 + 1;
  } while (lVar3 != 3);
  return;
}

Assistant:

void TextureCubeArrayShader::setFace (tcu::CubeFace face)
{
	static const float s_cubeTransforms[][3*3] =
	{
		// Face -X: (x, y, 1) -> (-1, -(2*y-1), +(2*x-1))
		{  0.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f,
		   2.0f,  0.0f, -1.0f },
		// Face +X: (x, y, 1) -> (+1, -(2*y-1), -(2*x-1))
		{  0.0f,  0.0f,  1.0f,
		   0.0f, -2.0f,  1.0f,
		  -2.0f,  0.0f,  1.0f },
		// Face -Y: (x, y, 1) -> (+(2*x-1), -1, -(2*y-1))
		{  2.0f,  0.0f, -1.0f,
		   0.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f },
		// Face +Y: (x, y, 1) -> (+(2*x-1), +1, +(2*y-1))
		{  2.0f,  0.0f, -1.0f,
		   0.0f,  0.0f,  1.0f,
		   0.0f,  2.0f, -1.0f },
		// Face -Z: (x, y, 1) -> (-(2*x-1), -(2*y-1), -1)
		{ -2.0f,  0.0f,  1.0f,
		   0.0f, -2.0f,  1.0f,
		   0.0f,  0.0f, -1.0f },
		// Face +Z: (x, y, 1) -> (+(2*x-1), -(2*y-1), +1)
		{  2.0f,  0.0f, -1.0f,
		   0.0f, -2.0f,  1.0f,
		   0.0f,  0.0f,  1.0f }
	};
	DE_ASSERT(de::inBounds<int>(face, 0, tcu::CUBEFACE_LAST));
	m_coordMat = tcu::Mat3(s_cubeTransforms[face]);
}